

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ushort *puVar6;
  byte *p;
  byte *pbVar7;
  ushort *puVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined7 in_register_00000031;
  u64 n;
  byte *pbVar12;
  ulong uVar13;
  ushort *puVar14;
  
  if (((int)CONCAT71(in_register_00000031,desiredEnc) == 1) || (pMem->enc == '\x01')) {
    uVar13 = (ulong)pMem->n;
    if (desiredEnc == '\x01') {
      uVar13 = uVar13 & 0xfffffffffffffffe;
      pMem->n = (int)uVar13;
      n = uVar13 * 2 + 1;
    }
    else {
      n = uVar13 * 2 + 2;
    }
    puVar6 = (ushort *)pMem->z;
    p = (byte *)sqlite3DbMallocRaw(pMem->db,n);
    if (p == (byte *)0x0) {
      return 7;
    }
    puVar8 = (ushort *)(uVar13 + (long)puVar6);
    if (pMem->enc == '\x01') {
      pbVar7 = p;
      if (desiredEnc == '\x02') {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar14 = (ushort *)((long)puVar6 + 1);
          puVar6 = puVar14;
          uVar10 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_00165f70:
            *(short *)pbVar7 = (short)uVar10;
            pbVar7 = pbVar7 + 2;
          }
          else {
            uVar9 = (uint)""[bVar2 - 0xc0];
            while ((puVar6 = puVar8, puVar14 != puVar8 &&
                   (uVar3 = *puVar14, puVar6 = puVar14, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
              puVar14 = (ushort *)((long)puVar14 + 1);
              uVar9 = uVar9 << 6 | (byte)uVar3 & 0x3f;
            }
            uVar10 = 0xfffd;
            if (((((uVar9 & 0xfffffffe) == 0xfffe) || (uVar9 < 0x80)) ||
                ((uVar9 & 0xfffff800) == 0xd800)) || (uVar10 = uVar9, uVar9 < 0x10000))
            goto LAB_00165f70;
            *pbVar7 = (byte)(uVar9 - 0x10000 >> 10) & 0xc0 | (byte)(uVar9 >> 10) & 0x3f;
            pbVar7[1] = (byte)(uVar9 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar7[2] = (byte)uVar9;
            pbVar7[3] = (byte)(uVar9 >> 8) & 3 | 0xdc;
            pbVar7 = pbVar7 + 4;
          }
        }
      }
      else {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar14 = (ushort *)((long)puVar6 + 1);
          puVar6 = puVar14;
          uVar10 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_00166176:
            uVar9 = uVar10;
            pbVar12 = pbVar7 + 1;
            *pbVar7 = (byte)(uVar9 >> 8);
            lVar11 = 2;
          }
          else {
            uVar9 = (uint)""[bVar2 - 0xc0];
            while ((puVar6 = puVar8, puVar14 != puVar8 &&
                   (uVar3 = *puVar14, puVar6 = puVar14, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
              puVar14 = (ushort *)((long)puVar14 + 1);
              uVar9 = uVar9 << 6 | (byte)uVar3 & 0x3f;
            }
            uVar10 = 0xfffd;
            if ((((uVar9 & 0xfffffffe) == 0xfffe) || (uVar9 < 0x80)) ||
               (((uVar9 & 0xfffff800) == 0xd800 || (uVar10 = uVar9, uVar9 < 0x10000))))
            goto LAB_00166176;
            *pbVar7 = (byte)(uVar9 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar7[1] = (byte)(uVar9 - 0x10000 >> 10) & 0xc0 | (byte)(uVar9 >> 10) & 0x3f;
            pbVar12 = pbVar7 + 3;
            pbVar7[2] = (byte)(uVar9 >> 8) & 3 | 0xdc;
            lVar11 = 4;
          }
          pbVar7 = pbVar7 + lVar11;
          *pbVar12 = (byte)uVar9;
        }
      }
      pMem->n = (int)pbVar7 - (int)p;
      *pbVar7 = 0;
      pbVar7 = pbVar7 + 1;
    }
    else {
      pbVar7 = p;
      if (pMem->enc == '\x02') {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar14 = puVar6 + 1;
          bVar1 = *(byte *)((long)puVar6 + 1);
          uVar3 = *puVar6;
          if (((bVar1 & 0xf8) == 0xd8) && (puVar14 < puVar8)) {
            uVar4 = puVar6[1];
            bVar1 = *(byte *)((long)puVar6 + 3);
            iVar5 = (uVar3 & 0x3c0) * 0x400;
            *pbVar7 = (byte)(iVar5 + 0x10000U >> 0x12) | 0xf0;
            pbVar7[1] = (byte)(iVar5 + ((uint)bVar2 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80;
            pbVar7[2] = (byte)(((bVar1 & 3) << 8 | (uint)(byte)uVar4 | (uint)bVar2 << 10) >> 6) &
                        0x3f | 0x80;
            pbVar7[3] = (byte)uVar4 & 0x3f | 0x80;
            pbVar7 = pbVar7 + 4;
            puVar6 = puVar6 + 2;
          }
          else {
            puVar6 = puVar14;
            if (uVar3 < 0x80) {
              *pbVar7 = bVar2;
              pbVar7 = pbVar7 + 1;
            }
            else if (bVar1 < 8) {
              *pbVar7 = (byte)(uVar3 >> 6) | 0xc0;
              pbVar7[1] = bVar2 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 2;
            }
            else {
              *pbVar7 = bVar1 >> 4 | 0xe0;
              pbVar7[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
              pbVar7[2] = bVar2 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 3;
            }
          }
        }
      }
      else {
        while (puVar6 < puVar8) {
          bVar2 = (byte)*puVar6;
          puVar14 = puVar6 + 1;
          bVar1 = *(byte *)((long)puVar6 + 1);
          uVar3 = CONCAT11(bVar2,bVar1);
          if (((bVar2 & 0xf8) == 0xd8) && (puVar14 < puVar8)) {
            uVar4 = puVar6[1];
            bVar2 = *(byte *)((long)puVar6 + 3);
            iVar5 = (uVar3 & 0x3c0) * 0x400;
            *pbVar7 = (byte)(iVar5 + 0x10000U >> 0x12) | 0xf0;
            pbVar7[1] = (byte)(iVar5 + ((uint)bVar1 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80;
            pbVar7[2] = (byte)((((byte)uVar4 & 3) << 8 | (uint)bVar2 | (uint)bVar1 << 10) >> 6) &
                        0x3f | 0x80;
            pbVar7[3] = bVar2 & 0x3f | 0x80;
            pbVar7 = pbVar7 + 4;
            puVar6 = puVar6 + 2;
          }
          else {
            puVar6 = puVar14;
            if (uVar3 < 0x80) {
              *pbVar7 = bVar1;
              pbVar7 = pbVar7 + 1;
            }
            else if (bVar2 < 8) {
              *pbVar7 = (byte)(uVar3 >> 6) | 0xc0;
              pbVar7[1] = bVar1 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 2;
            }
            else {
              *pbVar7 = bVar2 >> 4 | 0xe0;
              pbVar7[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
              pbVar7[2] = bVar1 & 0x3f | 0x80;
              pbVar7 = pbVar7 + 3;
            }
          }
        }
      }
      pMem->n = (int)pbVar7 - (int)p;
    }
    *pbVar7 = 0;
    uVar3 = pMem->flags;
    sqlite3VdbeMemRelease(pMem);
    pMem->flags = uVar3 & 0x83d | 0x202;
    pMem->enc = desiredEnc;
    pMem->z = (char *)p;
    pMem->zMalloc = (char *)p;
    iVar5 = sqlite3DbMallocSize(pMem->db,p);
    pMem->szMalloc = iVar5;
  }
  else {
    iVar5 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar5 != 0) {
      return 7;
    }
    puVar6 = (ushort *)pMem->z;
    puVar8 = (ushort *)(((long)pMem->n & 0xfffffffffffffffeU) + (long)puVar6);
    for (; puVar6 < puVar8; puVar6 = puVar6 + 1) {
      *puVar6 = *puVar6 << 8 | *puVar6 >> 8;
    }
    pMem->enc = desiredEnc;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  sqlite3_int64 len;          /* Maximum length of output string in bytes */
  unsigned char *zOut;        /* Output buffer */
  unsigned char *zIn;         /* Input iterator */
  unsigned char *zTerm;       /* End of input */
  unsigned char *z;           /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    StrAccum acc;
    char zBuf[1000];
    sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
    sqlite3VdbeMemPrettyPrint(pMem, &acc);
    fprintf(stderr, "INPUT:  %s\n", sqlite3StrAccumFinish(&acc));
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM_BKPT;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = 2 * (sqlite3_int64)pMem->n + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = 2 * (sqlite3_int64)pMem->n + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM_BKPT;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        c = *(zIn++);
        c += (*(zIn++))<<8;
        if( c>=0xd800 && c<0xe000 ){
#ifdef SQLITE_REPLACE_INVALID_UTF
          if( c>=0xdc00 || zIn>=zTerm ){
            c = 0xfffd;
          }else{
            int c2 = *(zIn++);
            c2 += (*(zIn++))<<8;
            if( c2<0xdc00 || c2>=0xe000 ){
              zIn -= 2;
              c = 0xfffd;
            }else{
              c = ((c&0x3ff)<<10) + (c2&0x3ff) + 0x10000;
            }
          }
#else
          if( zIn<zTerm ){
            int c2 = (*zIn++);
            c2 += ((*zIn++)<<8);
            c = (c2&0x03FF) + ((c&0x003F)<<10) + (((c&0x03C0)+0x0040)<<10);
          }
#endif
        }
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        c = (*(zIn++))<<8;
        c += *(zIn++);
        if( c>=0xd800 && c<0xe000 ){
#ifdef SQLITE_REPLACE_INVALID_UTF
          if( c>=0xdc00 || zIn>=zTerm ){
            c = 0xfffd;
          }else{
            int c2 = (*(zIn++))<<8;
            c2 += *(zIn++);
            if( c2<0xdc00 || c2>=0xe000 ){
              zIn -= 2;
              c = 0xfffd;
            }else{
              c = ((c&0x3ff)<<10) + (c2&0x3ff) + 0x10000;
            }
          }
#else
          if( zIn<zTerm ){
            int c2 = ((*zIn++)<<8);
            c2 += (*zIn++);
            c = (c2&0x03FF) + ((c&0x003F)<<10) + (((c&0x03C0)+0x0040)<<10);
          }
#endif
        }
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = MEM_Str|MEM_Term|(pMem->flags&(MEM_AffMask|MEM_Subtype));
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = c;
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    StrAccum acc;
    char zBuf[1000];
    sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
    sqlite3VdbeMemPrettyPrint(pMem, &acc);
    fprintf(stderr, "OUTPUT: %s\n", sqlite3StrAccumFinish(&acc));
  }
#endif
  return SQLITE_OK;
}